

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

size_t __thiscall CLI::App::count(App *this,string *name)

{
  pointer puVar1;
  Option *pOVar2;
  bool bVar3;
  OptionNotFound *this_00;
  pointer puVar4;
  string local_70;
  string local_50;
  
  puVar4 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar4 == puVar1) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_70,(string *)name);
      OptionNotFound::OptionNotFound(this_00,&local_70);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
    }
    pOVar2 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,(string *)name);
    bVar3 = Option::check_name(pOVar2,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) break;
    puVar4 = puVar4 + 1;
  }
  pOVar2 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
           .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  return (long)*(pointer *)
                ((long)&(pOVar2->results_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8) -
         *(long *)&(pOVar2->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl >> 5;
}

Assistant:

size_t count(std::string name) const {
        for(const Option_p &opt : options_) {
            if(opt->check_name(name)) {
                return opt->count();
            }
        }
        throw OptionNotFound(name);
    }